

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

Vec_Int_t * Ivy_ManDfsSeq(Ivy_Man_t *p,Vec_Int_t **pvLatches)

{
  int i;
  void *pvVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *vNodes;
  int iVar3;
  int i_00;
  
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,iVar3);
    if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 8) & 0x30) != 0)) {
      __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDfs.c"
                    ,0x81,"Vec_Int_t *Ivy_ManDfsSeq(Ivy_Man_t *, Vec_Int_t **)");
    }
  }
  p_00 = Vec_IntAlloc(p->nObjs[4]);
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    piVar2 = (int *)Vec_PtrEntry(p->vObjs,iVar3);
    if ((piVar2 != (int *)0x0) && ((piVar2[2] & 0xfU) == 4)) {
      Vec_IntPush(p_00,*piVar2);
    }
  }
  vNodes = Vec_IntAlloc(p->nObjs[6] + p->nObjs[5]);
  for (iVar3 = 0; iVar3 < p->vPos->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(p->vPos,iVar3);
    Ivy_ManDfs_rec(p,(Ivy_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),vNodes);
  }
  iVar3 = p_00->nSize;
  for (i_00 = 0; i_00 < iVar3; i_00 = i_00 + 1) {
    i = Vec_IntEntry(p_00,i_00);
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if (pvVar1 == (void *)0x0) break;
    Ivy_ManDfs_rec(p,(Ivy_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),vNodes);
  }
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,iVar3);
    if (pvVar1 != (void *)0x0) {
      *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) & 0xef;
    }
  }
  if (pvLatches == (Vec_Int_t **)0x0) {
    free(p_00->pArray);
    free(p_00);
  }
  else {
    *pvLatches = p_00;
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Ivy_ManDfsSeq( Ivy_Man_t * p, Vec_Int_t ** pvLatches )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Obj_t * pObj;
    int i;
//    assert( Ivy_ManLatchNum(p) > 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the latches
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
//    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );

// temporary!!!

    if ( pvLatches == NULL )
        Vec_IntFree( vLatches );
    else
        *pvLatches = vLatches;
    return vNodes;
}